

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_utils.c
# Opt level: O1

asterism_str asterism_strstrip(asterism_str s)

{
  char *pcVar1;
  ushort **ppuVar2;
  size_t sVar3;
  char *pcVar4;
  asterism_str aVar5;
  
  sVar3 = s.len;
  pcVar4 = s.p;
  if (sVar3 != 0) {
    ppuVar2 = __ctype_b_loc();
    pcVar1 = pcVar4 + sVar3;
    do {
      if ((*(byte *)((long)*ppuVar2 + (long)*pcVar4 * 2 + 1) & 0x20) == 0) goto LAB_0010eeee;
      pcVar4 = pcVar4 + 1;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    sVar3 = 0;
    pcVar4 = pcVar1;
  }
LAB_0010eeee:
  if (sVar3 != 0) {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (long)pcVar4[sVar3 - 1] * 2 + 1) & 0x20) == 0)
      goto LAB_0010ef0f;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    sVar3 = 0;
  }
LAB_0010ef0f:
  aVar5.len = sVar3;
  aVar5.p = pcVar4;
  return aVar5;
}

Assistant:

struct asterism_str asterism_strstrip(struct asterism_str s)
{
    while (s.len > 0 && isspace((int)*s.p))
    {
        s.p++;
        s.len--;
    }
    while (s.len > 0 && isspace((int)*(s.p + s.len - 1)))
    {
        s.len--;
    }
    return s;
}